

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiOldColumns *pIVar1;
  ImGuiOldColumnData *pIVar2;
  float fVar3;
  ImVec2 IVar4;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1 == (ImGuiOldColumns *)0x0) {
    IVar4 = GetContentRegionAvail();
    fVar3 = IVar4.x;
  }
  else {
    if (column_index < 0) {
      column_index = pIVar1->Current;
    }
    if (((column_index < -1) || ((pIVar1->Columns).Size <= (int)(column_index + 1U))) ||
       (column_index < 0)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                    ,0x706,
                    "T &ImVector<ImGuiOldColumnData>::operator[](int) [T = ImGuiOldColumnData]");
    }
    pIVar2 = (pIVar1->Columns).Data;
    fVar3 = (pIVar1->OffMaxX - pIVar1->OffMinX) *
            (pIVar2[column_index + 1U].OffsetNorm - pIVar2[(uint)column_index].OffsetNorm);
  }
  return fVar3;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return GetContentRegionAvail().x;

    if (column_index < 0)
        column_index = columns->Current;
    return GetColumnOffsetFromNorm(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}